

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_dest(REF_AGENTS ref_agents,REF_INT id,REF_INT *dest)

{
  REF_INT *dest_local;
  REF_INT id_local;
  REF_AGENTS ref_agents_local;
  
  *dest = -1;
  switch(ref_agents->agent[id].mode) {
  case REF_AGENT_UNUSED:
  case REF_AGENT_NEW:
  case REF_AGENT_MODE_LAST:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x107,
           "ref_agents_dest","has no dest");
    return 1;
  case REF_AGENT_WALKING:
    *dest = ref_agents->agent[id].part;
    break;
  case REF_AGENT_AT_BOUNDARY:
    *dest = ref_agents->agent[id].home;
    break;
  case REF_AGENT_HOP_PART:
    *dest = ref_agents->agent[id].part;
    break;
  case REF_AGENT_SUGGESTION:
    *dest = ref_agents->agent[id].home;
    break;
  case REF_AGENT_ENCLOSING:
    *dest = ref_agents->agent[id].home;
    break;
  case REF_AGENT_TERMINATED:
    *dest = ref_agents->agent[id].home;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_agents_dest(REF_AGENTS ref_agents, REF_INT id,
                                          REF_INT *dest) {
  *dest = REF_EMPTY;
  switch (ref_agent_mode(ref_agents, id)) {
    case REF_AGENT_WALKING:
      *dest = ref_agent_part(ref_agents, id);
      break;
    case REF_AGENT_AT_BOUNDARY:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_HOP_PART:
      *dest = ref_agent_part(ref_agents, id);
      break;
    case REF_AGENT_SUGGESTION:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_ENCLOSING:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_TERMINATED:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_UNUSED:
    case REF_AGENT_NEW:
    case REF_AGENT_MODE_LAST:
      THROW("has no dest");
  }
  return REF_SUCCESS;
}